

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * chaiscript::exception::eval_error::format_location<chaiscript::AST_Node>
                   (string *__return_storage_ptr__,AST_Node *t)

{
  ostream *poVar1;
  string *psVar2;
  File_Position *pFVar3;
  ostringstream local_190 [8];
  ostringstream oss;
  AST_Node *t_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"(");
  psVar2 = AST_Node::filename_abi_cxx11_(t);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1," ");
  pFVar3 = AST_Node::start(t);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pFVar3->line);
  poVar1 = std::operator<<(poVar1,", ");
  pFVar3 = AST_Node::start(t);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pFVar3->column);
  std::operator<<(poVar1,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_location(const T &t) {
        std::ostringstream oss;
        oss << "(" << t.filename() << " " << t.start().line << ", " << t.start().column << ")";
        return oss.str();
      }